

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

string * qclab::io::left_of(string *__return_storage_ptr__,string *str,string *delimiter)

{
  long lVar1;
  allocator<char> aaStack_38 [32];
  
  lVar1 = std::__cxx11::string::find_first_of((string *)str,(ulong)delimiter);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else if (lVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",aaStack_38);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    std::__cxx11::string::substr((ulong)aaStack_38,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)aaStack_38);
    std::__cxx11::string::~string((string *)aaStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string left_of( std::string& str , const std::string delimiter ) {
    auto pos = str.find_first_of( delimiter ) ;
    if ( pos == 0 ) {
      return "" ;
    } else if ( pos == std::string::npos ) {
      return str ;
    }
    std::string left_of = str.substr( 0 , pos ) ;
    str = str.substr( pos + 1 ) ;
    return left_of ;
  }